

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void regenerateBuffer(void)

{
  int n;
  ulong uVar1;
  long lVar2;
  float fVar3;
  vec3 pos;
  
  std::vector<float,_std::allocator<float>_>::resize(&shape_scalars,vertex_count);
  lVar2 = 2;
  for (uVar1 = 0; uVar1 < vertex_count; uVar1 = uVar1 + 1) {
    pos.field_0.field_0.x =
         *(value_type *)
          ((long)sphere_positions.
                 super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar2 * 4 + -8);
    pos.field_0.field_0.y =
         *(value_type *)
          ((long)sphere_positions.
                 super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar2 * 4 + -4);
    pos.field_0.field_0.z =
         *(value_type *)
          ((long)&(sphere_positions.
                   super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar2 * 4);
    fVar3 = legendre_total(&pos,legendre_params);
    shape_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar1] = fVar3;
    lVar2 = lVar2 + 3;
  }
  (*__glewBindBuffer)(0x8892,vertex_buffer);
  (*__glewBufferData)(0x8892,vertex_count << 2,
                      shape_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,0x88e8);
  return;
}

Assistant:

void regenerateBuffer() {
    Perf stat("Regenerate legendre buffer");
    shape_scalars.resize(vertex_count);
    for (int n = 0; n < vertex_count; n++) {
        vec3 pos = sphere_positions[n];
        shape_scalars[n] = legendre_total(pos, legendre_params);
    }

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, vertex_count * sizeof(float), shape_scalars.data(), GL_DYNAMIC_DRAW);
}